

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void HighsHashHelpers::sparse_inverse_combine(u64 *hash,HighsInt index)

{
  ulong uVar1;
  ulong uVar2;
  u64 a_00;
  u64 uVar3;
  uint in_ESI;
  ulong *in_RDI;
  u64 degree;
  u64 a;
  
  uVar3 = *(u64 *)(&DAT_00884e50 + (long)(int)(in_ESI & 0x3f) * 8);
  M61();
  a_00 = M61();
  uVar3 = modexp_M61(a_00,uVar3);
  *in_RDI = (a_00 - uVar3) + *in_RDI;
  uVar1 = *in_RDI;
  uVar2 = *in_RDI;
  uVar3 = M61();
  *in_RDI = (uVar1 >> 0x3d) + (uVar2 & uVar3);
  uVar1 = *in_RDI;
  uVar3 = M61();
  if (uVar3 <= uVar1) {
    uVar3 = M61();
    *in_RDI = *in_RDI - uVar3;
  }
  return;
}

Assistant:

static void sparse_inverse_combine(u64& hash, HighsInt index) {
    // same hash algorithm as sparse_combine(), but for updating a hash value to
    // the state before it was changed with a call to sparse_combine(). This is
    // easily possible as the hash value just uses finite field arithmetic. We
    // can simply add the additive inverse of the previous hash value. This is a
    // very useful routine for symmetry detection. During partition refinement
    // the hashes do not need to be recomputed but can be updated with this
    // procedure.

    u64 a = c[index & 63] & M61();
    u64 degree = (static_cast<u64>(index) >> 6) + 1;
    // add the additive inverse (M61() - hashvalue) instead of the hash value
    // itself
    hash += M61() - modexp_M61(a, degree);
    hash = (hash >> 61) + (hash & M61());
    if (hash >= M61()) hash -= M61();
    assert(hash < M61());
  }